

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  byte *pbVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  int iVar7;
  ImVec2 IVar8;
  ImDrawList *pIVar9;
  ImGuiTabBar *pIVar10;
  ImGuiViewportP *pIVar11;
  ImGuiCol idx;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ImGuiViewportFlags IVar16;
  ImGuiViewportFlags IVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  bool bVar21;
  bool bVar22;
  ImU32 IVar23;
  ImGuiID IVar24;
  ImGuiID IVar25;
  ImGuiWindow **ppIVar26;
  ImGuiDockNode *pIVar27;
  ImGuiWindow *pIVar28;
  ImGuiDockNode *pIVar29;
  ImGuiWindow *pIVar30;
  ImGuiTabItem *pIVar31;
  ImGuiID *pIVar32;
  char *label;
  ushort uVar33;
  short sVar34;
  uint uVar35;
  ImVec2 *pIVar36;
  int buf_size;
  bool *p_open;
  int window_n;
  int iVar37;
  int iVar38;
  int iVar39;
  ImGuiPayload *this;
  ImGuiTabBar *this_00;
  int tab_n;
  uint uVar40;
  int iVar41;
  long lVar42;
  ImVector<ImGuiWindow_*> *pIVar43;
  char cVar44;
  long lVar45;
  bool bVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  ImRect outer;
  ImRect inner;
  ImGuiCol IStackY_110;
  ImGuiID local_fc;
  uint local_e8;
  char window_label [20];
  short local_8c;
  bool tab_open;
  undefined7 uStack_87;
  float fStack_80;
  float fStack_7c;
  ImRect tab_bar_rect;
  ImVec2 local_38;
  
  pIVar18 = GImGui;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3285,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xba = node->field_0xba & 0xf7;
  node->CentralNode = (ImGuiDockNode *)0x0;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    DockNodeUpdateVisibleFlagAndInactiveChilds(node);
    window_label[0] = '\0';
    window_label[1] = '\0';
    window_label[2] = '\0';
    window_label[3] = '\0';
    window_label[4] = '\0';
    window_label[5] = '\0';
    window_label[6] = '\0';
    window_label[7] = '\0';
    window_label[8] = '\0';
    window_label[9] = '\0';
    window_label[10] = '\0';
    window_label[0xb] = '\0';
    window_label[0xc] = '\0';
    window_label[0xd] = '\0';
    window_label[0xe] = '\0';
    window_label[0xf] = '\0';
    window_label[0x10] = '\0';
    window_label[0x11] = '\0';
    window_label[0x12] = '\0';
    window_label[0x13] = '\0';
    DockNodeFindInfo(node,(ImGuiDockNodeFindInfoResults *)window_label);
    node->CentralNode = (ImGuiDockNode *)CONCAT44(window_label._4_4_,window_label._0_4_);
    pIVar29 = (ImGuiDockNode *)CONCAT44(window_label._12_4_,window_label._8_4_);
    pIVar27 = (ImGuiDockNode *)0x0;
    if (window_label._16_4_ == 1) {
      pIVar27 = pIVar29;
    }
    node->OnlyNodeWithWindows = pIVar27;
    if (pIVar29 == (ImGuiDockNode *)0x0 || node->LastFocusedNodeId != 0) {
      if (pIVar29 == (ImGuiDockNode *)0x0) goto LAB_00132b13;
    }
    else {
      node->LastFocusedNodeId = pIVar29->ID;
    }
    pIVar43 = &pIVar29->Windows;
    ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
    pIVar28 = *ppIVar26;
    IVar25 = (pIVar28->WindowClass).ParentViewportId;
    IVar16 = (pIVar28->WindowClass).ViewportFlagsOverrideSet;
    IVar17 = (pIVar28->WindowClass).ViewportFlagsOverrideClear;
    uVar12 = *(undefined4 *)((long)&(pIVar28->WindowClass).ViewportFlagsOverrideSet + 2);
    uVar13 = *(undefined4 *)((long)&(pIVar28->WindowClass).ViewportFlagsOverrideClear + 2);
    uVar14 = *(undefined4 *)((long)&(pIVar28->WindowClass).DockNodeFlagsOverrideSet + 2);
    uVar15 = *(undefined4 *)((long)&(pIVar28->WindowClass).DockNodeFlagsOverrideClear + 2);
    (node->WindowClass).ClassId = (pIVar28->WindowClass).ClassId;
    (node->WindowClass).ParentViewportId = IVar25;
    (node->WindowClass).ViewportFlagsOverrideSet = IVar16;
    (node->WindowClass).ViewportFlagsOverrideClear = IVar17;
    *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) = uVar12;
    *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar13;
    *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar14;
    *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideClear + 2) = uVar15;
    for (iVar38 = 1; iVar38 < pIVar43->Size; iVar38 = iVar38 + 1) {
      ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar38);
      if (((*ppIVar26)->WindowClass).DockingAllowUnclassed == false) {
        ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar38);
        pIVar28 = *ppIVar26;
        IVar25 = (pIVar28->WindowClass).ParentViewportId;
        IVar16 = (pIVar28->WindowClass).ViewportFlagsOverrideSet;
        IVar17 = (pIVar28->WindowClass).ViewportFlagsOverrideClear;
        uVar12 = *(undefined4 *)((long)&(pIVar28->WindowClass).ViewportFlagsOverrideSet + 2);
        uVar13 = *(undefined4 *)((long)&(pIVar28->WindowClass).ViewportFlagsOverrideClear + 2);
        uVar14 = *(undefined4 *)((long)&(pIVar28->WindowClass).DockNodeFlagsOverrideSet + 2);
        uVar15 = *(undefined4 *)((long)&(pIVar28->WindowClass).DockNodeFlagsOverrideClear + 2);
        (node->WindowClass).ClassId = (pIVar28->WindowClass).ClassId;
        (node->WindowClass).ParentViewportId = IVar25;
        (node->WindowClass).ViewportFlagsOverrideSet = IVar16;
        (node->WindowClass).ViewportFlagsOverrideClear = IVar17;
        *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 2) = uVar12;
        *(undefined4 *)((long)&(node->WindowClass).ViewportFlagsOverrideClear + 2) = uVar13;
        *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideSet + 2) = uVar14;
        *(undefined4 *)((long)&(node->WindowClass).DockNodeFlagsOverrideClear + 2) = uVar15;
        break;
      }
    }
  }
LAB_00132b13:
  if ((node->TabBar != (ImGuiTabBar *)0x0) && ((node->LocalFlags & 0x1000) != 0)) {
    DockNodeRemoveTabBar(node);
  }
  pIVar43 = &node->Windows;
  iVar38 = (node->Windows).Size;
  if ((((iVar38 < 2) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
      ((node->LocalFlags & 0x400U) == 0)) &&
     ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 &&
      ((pIVar18->IO).ConfigDockingAlwaysTabBar == false)))) {
    if (iVar38 == 0) {
LAB_00133db8:
      DockNodeHideHostWindow(node);
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
      node->WantCloseTabId = 0;
      node->field_0xb9 = node->field_0xb9 & 0x87;
      node->LastFrameActive = pIVar18->FrameCount;
      if ((node->field_0xba & 1) == 0) {
        return;
      }
      if (pIVar43->Size != 1) {
        return;
      }
      ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
      DockNodeStartMouseMovingWindow(node,*ppIVar26);
      return;
    }
    ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
    if (((*ppIVar26)->WindowClass).DockingAlwaysTabBar == false) {
      if (pIVar43->Size == 1) {
        ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
        pIVar28 = *ppIVar26;
        node->Pos = pIVar28->Pos;
        node->Size = pIVar28->SizeFull;
        *(ushort *)&node->field_0xb8 = (ushort)*(undefined4 *)&node->field_0xb8 & 0xfe00 | 0x92;
        pIVar30 = node->HostWindow;
        if (pIVar30 != (ImGuiWindow *)0x0) {
          if (pIVar18->NavWindow == pIVar30) {
            FocusWindow(pIVar28);
            pIVar30 = node->HostWindow;
            if (pIVar30 == (ImGuiWindow *)0x0) goto LAB_00133db8;
          }
          pIVar11 = pIVar30->Viewport;
          pIVar28->Viewport = pIVar11;
          pIVar28->ViewportId = pIVar30->ViewportId;
          if (pIVar30->ViewportOwned == true) {
            pIVar11->Window = pIVar28;
            pIVar28->ViewportOwned = true;
          }
        }
      }
      goto LAB_00133db8;
    }
  }
  if ((((node->field_0xb9 & 2) != 0) && (node->HostWindow == (ImGuiWindow *)0x0)) &&
     ((node->ParentNode == (ImGuiDockNode *)0x0 &&
      (((node->LocalFlags & 0x400U) == 0 && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)))))) {
    iVar38 = pIVar43->Size;
    if (iVar38 < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,12999,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    IVar25 = node->SelectedTabId;
    if (IVar25 != 0) {
      for (iVar37 = 0; iVar37 < iVar38; iVar37 = iVar37 + 1) {
        ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar37);
        if ((*ppIVar26)->ID == IVar25) {
          ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar37);
          pIVar28 = *ppIVar26;
          if (pIVar28 != (ImGuiWindow *)0x0) goto LAB_00133e3f;
          break;
        }
        iVar38 = pIVar43->Size;
      }
    }
    ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
    pIVar28 = *ppIVar26;
LAB_00133e3f:
    if (('\0' < pIVar28->AutoFitFramesX) || ('\0' < pIVar28->AutoFitFramesY)) {
      node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
      return;
    }
  }
  uVar40 = node->SharedFlags | node->LocalFlags;
  if (((uint)node->LocalFlags >> 10 & 1) == 0) {
    iVar38 = (node->Windows).Size;
    uVar35 = (uint)((uVar40 >> 0xe & 1) == 0 && 0 < iVar38) << 0xc |
             *(uint *)&node->field_0xb8 & 0xffffc7ff |
             (uint)(-1 < (short)uVar40 && 0 < iVar38) << 0xb;
    *(short *)&node->field_0xb8 = (short)uVar35;
    for (iVar37 = 0; iVar37 < iVar38; iVar37 = iVar37 + 1) {
      ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar37);
      pIVar28 = *ppIVar26;
      pIVar28->field_0x492 = pIVar28->field_0x492 & 0xfe | 1 < (node->Windows).Size;
      iVar38._0_1_ = pIVar28->HasCloseButton;
      iVar38._1_1_ = pIVar28->ResizeBorderHeld;
      iVar38._2_2_ = pIVar28->BeginCount;
      uVar33 = (ushort)(iVar38 << 0xd) | *(ushort *)&node->field_0xb8;
      uVar35 = (uint)uVar33;
      *(ushort *)&node->field_0xb8 = uVar33;
      iVar38 = (node->Windows).Size;
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      if ((uVar35 >> 9 & 1) == 0) {
        bVar6 = false;
        pIVar28 = (ImGuiWindow *)0x0;
      }
      else {
        if (iVar38 < 1) {
          pIVar28 = (ImGuiWindow *)0x0;
        }
        else {
          ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
          pIVar28 = *ppIVar26;
          uVar35 = (uint)*(ushort *)&node->field_0xb8;
        }
        pIVar19 = GImGui;
        sVar34 = (short)(uVar35 << 0xd);
        if (pIVar28 == (ImGuiWindow *)0x0 || sVar34 != 0x4000) {
          if (sVar34 == 0x2000) {
            pIVar36 = &node->Pos;
            goto LAB_00132e52;
          }
        }
        else {
          pIVar36 = &pIVar28->Pos;
LAB_00132e52:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar19->NextWindowData).PosVal = *pIVar36;
          (pIVar19->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar19->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar19->NextWindowData).PosCond = 1;
          (pIVar19->NextWindowData).PosUndock = true;
        }
        pIVar19 = GImGui;
        sVar34 = (short)((uint)(int)(short)(*(int *)&node->field_0xb8 << 10) >> 0xd);
        if (sVar34 == 2 && pIVar28 != (ImGuiWindow *)0x0) {
          pIVar36 = &pIVar28->SizeFull;
LAB_00132eb9:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar19->NextWindowData).SizeVal = *pIVar36;
          (pIVar19->NextWindowData).SizeCond = 1;
        }
        else if (sVar34 == 1) {
          pIVar36 = &node->Size;
          goto LAB_00132eb9;
        }
        pIVar19 = GImGui;
        uVar33 = *(ushort *)&node->field_0xb8;
        if ((uVar33 & 0x38) == 0x10 && pIVar28 != (ImGuiWindow *)0x0) {
          bVar6 = pIVar28->Collapsed;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar19->NextWindowData).CollapsedVal = bVar6;
          (pIVar19->NextWindowData).CollapsedCond = 1;
          uVar33 = *(ushort *)&node->field_0xb8;
        }
        pIVar19 = GImGui;
        if ((uVar33 & 0x1c0) == 0x80 && pIVar28 != (ImGuiWindow *)0x0) {
          IVar25 = pIVar28->ViewportId;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar19->NextWindowData).ViewportId = IVar25;
        }
        SetNextWindowClass(&node->WindowClass);
        DockNodeGetHostWindowTitle(node,window_label,buf_size);
        tab_bar_rect.Min.x = 0.0;
        tab_bar_rect.Min.y = 0.0;
        PushStyleVar(1,&tab_bar_rect.Min);
        Begin(window_label,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar28 = pIVar18->CurrentWindow;
        node->HostWindow = pIVar28;
        pIVar28->DockNodeAsHost = node;
        IVar8 = pIVar28->Pos;
        (pIVar28->DC).CursorPos = IVar8;
        node->Pos = IVar8;
        node->Size = pIVar28->Size;
        if (node->HostWindow->Appearing == true) {
          BringWindowToDisplayFront(node->HostWindow);
        }
        *(ushort *)&node->field_0xb8 = *(ushort *)&node->field_0xb8 & 0xfe00;
        bVar6 = true;
      }
    }
    else {
      pIVar28 = node->ParentNode->HostWindow;
      node->HostWindow = pIVar28;
      *(ushort *)&node->field_0xb8 = (ushort)uVar35 & 0xfe00;
      bVar6 = false;
    }
    if (((node->field_0xba & 1) != 0) && (node->HostWindow != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow(node,node->HostWindow);
    }
  }
  else {
    pIVar28 = node->HostWindow;
    if (pIVar28 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x32dc,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    *(ushort *)&node->field_0xb8 =
         ((ushort)(uVar40 >> 2) & 0x1000 | (ushort)(uVar40 >> 4) & 0x800 |
         (ushort)*(undefined4 *)&node->field_0xb8 & 0xc7ff) ^ 0x1800;
    bVar6 = false;
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) && (node->TabBar != (ImGuiTabBar *)0x0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3333,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  if (node->ParentNode == (ImGuiDockNode *)0x0) {
    if (pIVar18->NavWindow != (ImGuiWindow *)0x0) {
      pIVar30 = pIVar18->NavWindow->RootWindowDockStop;
      pIVar29 = pIVar30->DockNode;
      if ((pIVar29 != (ImGuiDockNode *)0x0) && (pIVar30->ParentWindow == pIVar28)) {
        node->LastFocusedNodeId = pIVar29->ID;
      }
    }
    if (pIVar28 == (ImGuiWindow *)0x0) {
      bVar46 = false;
      goto LAB_0013304b;
    }
    uVar35 = uVar40 >> 3 & 1;
    cVar44 = (char)uVar35;
    if (uVar35 == 0) {
      pIVar29 = node->CentralNode;
LAB_00133417:
      bVar46 = true;
      if ((pIVar29 != (ImGuiDockNode *)0x0 & (byte)uVar40 >> 3) == 1) {
        bVar47 = false;
        if ((pIVar29->ChildNodes[0] != (ImGuiDockNode *)0x0) || ((pIVar29->Windows).Size != 0))
        goto LAB_00133053;
        if (GImGui->DragDropActive == true) {
          this = &GImGui->DragDropPayload;
          bVar46 = ImGuiPayload::IsDataType(this,"_IMWINDOW");
          if ((!bVar46) || (bVar46 = DockNodeIsDropAllowed(pIVar28,*this->Data), !bVar46))
          goto LAB_0013348f;
        }
        else {
LAB_0013348f:
          if ((node->LocalFlags & 0x400) == 0) {
            __assert_fail("node->IsDockSpace()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x334c,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
          }
          fVar48 = (pIVar29->Pos).x;
          fVar49 = (pIVar29->Pos).y;
          window_label._0_4_ = fVar48 + 4.0;
          window_label._4_4_ = fVar49 + 4.0;
          window_label._8_4_ = (pIVar29->Size).x + fVar48 + -4.0;
          window_label._12_4_ = (pIVar29->Size).y + fVar49 + -4.0;
          if (((float)window_label._0_4_ <= (float)window_label._8_4_) &&
             ((float)window_label._4_4_ <= (float)window_label._12_4_)) {
            tab_bar_rect.Min.y = (float)window_label._12_4_ - (float)window_label._4_4_;
            tab_bar_rect.Min.x = (float)window_label._8_4_ - (float)window_label._0_4_;
            SetWindowHitTestHole(pIVar28,(ImVec2 *)window_label,&tab_bar_rect.Min);
            tab_bar_rect.Min.y = (float)window_label._12_4_ - (float)window_label._4_4_;
            tab_bar_rect.Min.x = (float)window_label._8_4_ - (float)window_label._0_4_;
            SetWindowHitTestHole(pIVar28->ParentWindow,(ImVec2 *)window_label,&tab_bar_rect.Min);
          }
        }
        bVar46 = true;
        bVar47 = true;
        goto LAB_00133053;
      }
      goto LAB_00133051;
    }
    ImDrawList::ChannelsSplit(pIVar28->DrawList,2);
    ImDrawList::ChannelsSetCurrent(pIVar28->DrawList,1);
    pIVar29 = node->CentralNode;
    if (node->ParentNode == (ImGuiDockNode *)0x0) goto LAB_00133417;
    bVar47 = false;
    bVar46 = true;
    cVar44 = '\x01';
  }
  else {
    bVar46 = pIVar28 != (ImGuiWindow *)0x0;
LAB_0013304b:
    pIVar29 = node->CentralNode;
    cVar44 = '\0';
LAB_00133051:
    bVar47 = false;
  }
LAB_00133053:
  if ((node->ParentNode == (ImGuiDockNode *)0x0) && (bVar46)) {
    DockNodeTreeUpdatePosSize(node,pIVar28->Pos,pIVar28->Size,false);
    DockNodeTreeUpdateSplitter(node);
  }
  if ((((bVar46) && (node->ChildNodes[0] == (ImGuiDockNode *)0x0)) && ((node->Windows).Size == 0))
     && (((uVar40 & 8) == 0 && ((*(ushort *)&node->field_0xb8 & 0x200) != 0)))) {
    pIVar9 = pIVar28->DrawList;
    window_label._0_4_ = (node->Size).x + (node->Pos).x;
    window_label._4_4_ = (node->Size).y + (node->Pos).y;
    IVar23 = GetColorU32(0x27,1.0);
    ImDrawList::AddRectFilled(pIVar9,&node->Pos,(ImVec2 *)window_label,IVar23,0.0,0xf);
  }
  if ((cVar44 != '\0') && ((node->field_0xb9 & 2) != 0)) {
    ImDrawList::ChannelsSetCurrent(pIVar28->DrawList,0);
    pIVar9 = pIVar28->DrawList;
    if (bVar47) {
      outer = ImGuiDockNode::Rect(node);
      inner = ImGuiDockNode::Rect(pIVar29);
      IVar23 = GetColorU32(2,1.0);
      RenderRectFilledWithHole(pIVar9,outer,inner,IVar23,0.0);
    }
    else {
      window_label._0_4_ = (node->Size).x + (node->Pos).x;
      window_label._4_4_ = (node->Size).y + (node->Pos).y;
      IVar23 = GetColorU32(2,1.0);
      ImDrawList::AddRectFilled(pIVar9,&node->Pos,(ImVec2 *)window_label,IVar23,0.0,0xf);
    }
    ImDrawList::ChannelsMerge(pIVar28->DrawList);
  }
  pIVar19 = GImGui;
  if (bVar46) {
    uVar33 = *(ushort *)&node->field_0xb8;
    if ((node->Windows).Size < 1) goto LAB_0013332f;
    iVar37 = node->LastFrameActive + 1;
    iVar38 = GImGui->FrameCount;
    IVar25 = node->WantCloseTabId;
    *(short *)&node->field_0xb8 = (short)(uVar33 & 0xbfff);
    node->WantCloseTabId = 0;
    pIVar29 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)(uVar33 & 0xbfff));
    if (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((pIVar19->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar19->NavWindow->RootWindowForTitleBarHighlight == pIVar28->RootWindow)) {
        bVar47 = pIVar29->LastFocusedNodeId == node->ID;
        goto LAB_0013331b;
      }
      local_e8 = 0;
    }
    else {
      bVar47 = pIVar19->NavWindowingTarget->DockNode == node;
LAB_0013331b:
      local_e8 = (uint)bVar47;
    }
    if ((node->LocalFlags & 0x3000U) == 0) {
      bVar47 = pIVar28->SkipItems;
      if (((uint)node->LocalFlags >> 10 & 1) == 0) {
        pIVar28->SkipItems = false;
        (pIVar28->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      PushOverrideID(0);
      pIVar10 = node->TabBar;
      this_00 = pIVar10;
      if (pIVar10 == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        this_00 = node->TabBar;
      }
      *(ushort *)&node->field_0xb8 =
           (ushort)*(undefined4 *)&node->field_0xb8 & 0xfbff | (ushort)(local_e8 << 10);
      uVar40 = node->LocalFlags | node->SharedFlags;
      if (((uVar40 >> 0xe & 1) == 0) && ((pIVar19->Style).WindowMenuButtonPosition != -1)) {
        bVar21 = IsPopupOpen("#WindowMenu",0);
        pIVar20 = GImGui;
        if (!bVar21) {
          bVar21 = true;
          goto LAB_00133677;
        }
        bVar21 = true;
        fVar48 = (node->Pos).x;
        if ((GImGui->Style).WindowMenuButtonPosition == 0) {
          fVar49 = 0.0;
        }
        else {
          fVar48 = fVar48 + (node->Size).x;
          fVar49 = 1.0;
        }
        local_fc = 0;
        fVar3 = (GImGui->Style).FramePadding.y;
        fVar4 = GImGui->FontSize;
        fVar5 = (node->Pos).y;
        (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
        (pIVar20->NextWindowData).PosVal.x = fVar48;
        (pIVar20->NextWindowData).PosVal.y = fVar3 + fVar3 + fVar4 + fVar5;
        (pIVar20->NextWindowData).PosPivotVal.x = fVar49;
        (pIVar20->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar20->NextWindowData).PosCond = 1;
        (pIVar20->NextWindowData).PosUndock = true;
        bVar22 = BeginPopup("#WindowMenu",0);
        if (bVar22) {
          node->field_0xb9 = node->field_0xb9 | 4;
          iVar41 = (this_00->Tabs).Size;
          if (iVar41 == 1) {
            bVar22 = MenuItem("Hide tab bar",(char *)0x0,
                              (bool)((byte)((uint)node->LocalFlags >> 0xd) & 1),true);
            IVar24 = 0;
            if (bVar22) {
              node->field_0xba = node->field_0xba | 4;
              IVar24 = 0;
            }
          }
          else {
            IVar24 = 0;
            for (iVar39 = 0; iVar39 < iVar41; iVar39 = iVar39 + 1) {
              pIVar31 = ImVector<ImGuiTabItem>::operator[](&this_00->Tabs,iVar39);
              if ((pIVar31->Flags & 0x200000) == 0) {
                label = ImGuiTabBar::GetTabName(this_00,pIVar31);
                window_label[0] = '\0';
                window_label[1] = '\0';
                window_label[2] = '\0';
                window_label[3] = '\0';
                window_label[4] = '\0';
                window_label[5] = '\0';
                window_label[6] = '\0';
                window_label[7] = '\0';
                bVar22 = Selectable(label,pIVar31->ID == this_00->SelectedTabId,0,
                                    (ImVec2 *)window_label);
                if (bVar22) {
                  IVar24 = pIVar31->ID;
                }
                SameLine(0.0,-1.0);
                Text("   ");
              }
              iVar41 = (this_00->Tabs).Size;
            }
          }
          EndPopup();
          if (IVar24 != 0) {
            this_00->NextSelectedTabId = IVar24;
            local_fc = IVar24;
          }
        }
        local_e8 = (uint)(byte)((byte)local_e8 | (node->field_0xb9 & 4) >> 2);
      }
      else {
        bVar21 = false;
LAB_00133677:
        local_fc = 0;
      }
      window_label[0] = '\0';
      window_label[1] = '\0';
      window_label[2] = '\0';
      window_label[3] = '\0';
      window_label[4] = '\0';
      window_label[5] = '\0';
      window_label[6] = '\0';
      window_label[7] = '\0';
      window_label[8] = '\0';
      window_label[9] = '\0';
      window_label[10] = '\0';
      window_label[0xb] = '\0';
      window_label[0xc] = '\0';
      window_label[0xd] = '\0';
      window_label[0xe] = '\0';
      window_label[0xf] = '\0';
      tab_bar_rect.Min.x = 0.0;
      tab_bar_rect.Min.y = 0.0;
      tab_bar_rect.Max.x = 0.0;
      tab_bar_rect.Max.y = 0.0;
      local_38.x = 0.0;
      local_38.y = 0.0;
      DockNodeCalcTabBarLayout(node,(ImRect *)window_label,&tab_bar_rect,&local_38);
      if ((char)local_e8 == '\0') {
        IStackY_110 = 10;
      }
      else {
        node->LastFrameFocused = pIVar19->FrameCount;
        IStackY_110 = 0xb;
      }
      idx = 0xc;
      if (pIVar28->Collapsed == false) {
        idx = IStackY_110;
      }
      IVar23 = GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled
                (pIVar28->DrawList,(ImVec2 *)window_label,(ImVec2 *)(window_label + 8),IVar23,
                 pIVar28->WindowRounding,3);
      if (bVar21) {
        IVar24 = ImGuiWindow::GetID(pIVar28,"#COLLAPSE",(char *)0x0);
        bVar21 = CollapseButton(IVar24,&local_38,node);
        if (bVar21) {
          OpenPopup("#WindowMenu",0);
        }
        bVar21 = IsItemActive();
        if (bVar21) {
          local_fc = this_00->SelectedTabId;
        }
      }
      iVar41 = (this_00->Tabs).Size;
      for (iVar39 = 0; iVar39 < pIVar43->Size; iVar39 = iVar39 + 1) {
        ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar39);
        pIVar30 = *ppIVar26;
        if ((pIVar19->NavWindow != (ImGuiWindow *)0x0) &&
           (pIVar19->NavWindow->RootWindowDockStop == pIVar30)) {
          this_00->SelectedTabId = pIVar30->ID;
        }
        pIVar31 = TabBarFindTabByID(this_00,pIVar30->ID);
        if (pIVar31 == (ImGuiTabItem *)0x0) {
          TabBarAddTab(this_00,0x400000,pIVar30);
        }
      }
      lVar45 = (long)(this_00->Tabs).Size;
      lVar42 = lVar45 * -0x30;
      for (; iVar39 = (int)lVar45, 0 < iVar39; lVar45 = lVar45 + -1) {
        pIVar31 = ImVector<ImGuiTabItem>::operator[](&this_00->Tabs,iVar39 + -1);
        if ((pIVar31->Flags & 0x400000) == 0) break;
        pIVar31 = ImVector<ImGuiTabItem>::operator[](&this_00->Tabs,iVar39 + -1);
        pbVar1 = (byte *)((long)&pIVar31->Flags + 2);
        *pbVar1 = *pbVar1 & 0xbf;
        lVar42 = lVar42 + 0x30;
      }
      iVar7 = (this_00->Tabs).Size;
      if (iVar39 < iVar7 && iVar39 + 1 < iVar7) {
        qsort((void *)((long)(this_00->Tabs).Data - lVar42),iVar7 - lVar45,0x30,
              TabItemComparerByDockOrder);
      }
      if ((pIVar10 == (ImGuiTabBar *)0x0) &&
         (pIVar31 = TabBarFindTabByID(this_00,node->SelectedTabId), pIVar31 != (ImGuiTabItem *)0x0))
      {
        pIVar32 = &node->SelectedTabId;
LAB_00133923:
        IVar24 = *pIVar32;
        this_00->NextSelectedTabId = IVar24;
        this_00->SelectedTabId = IVar24;
      }
      else if (iVar41 < (this_00->Tabs).Size) {
        pIVar31 = ImVector<ImGuiTabItem>::back(&this_00->Tabs);
        pIVar32 = &pIVar31->Window->ID;
        goto LAB_00133923;
      }
      uVar35 = local_e8 << 0x15 | 0x500003;
      if (pIVar28->Collapsed != false) {
        uVar35 = 0x500003;
      }
      BeginTabBarEx(this_00,&tab_bar_rect,uVar35,node);
      node->VisibleWindow = (ImGuiWindow *)0x0;
      for (iVar41 = 0; iVar41 < pIVar43->Size; iVar41 = iVar41 + 1) {
        ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,iVar41);
        pIVar30 = *ppIVar26;
        if (((((((byte)(uVar33 >> 0xe) & iVar37 == iVar38) == 0) &&
              (pIVar30->ID != (uint)(IVar25 != 0 && iVar37 == iVar38))) ||
             (pIVar30->HasCloseButton != true)) || ((pIVar30->Flags & 0x100000) != 0)) &&
           (pIVar19->FrameCount <= pIVar30->LastFrameActive + 1 || iVar37 != iVar38)) {
          tab_open = true;
          p_open = (bool *)0x0;
          if (pIVar30->HasCloseButton != false) {
            p_open = &tab_open;
          }
          TabItemEx(this_00,pIVar30->Name,p_open,
                    (uint)this_00->Flags >> 1 & 4 | (uint)pIVar30->Flags >> 0x14 & 1,pIVar30);
          IVar24 = pIVar30->ID;
          if (tab_open == false) {
            node->WantCloseTabId = IVar24;
          }
          if (this_00->VisibleTabId == IVar24) {
            node->VisibleWindow = pIVar30;
          }
          pIVar30->DockTabItemStatusFlags = (pIVar28->DC).LastItemStatusFlags;
          IVar8 = (pIVar28->DC).LastItemRect.Max;
          (pIVar30->DockTabItemRect).Min = (pIVar28->DC).LastItemRect.Min;
          (pIVar30->DockTabItemRect).Max = IVar8;
          if (((pIVar19->NavWindow != (ImGuiWindow *)0x0) &&
              (pIVar19->NavWindow->RootWindowDockStop == pIVar30)) &&
             (((pIVar30->DC).NavLayerActiveMask & 2) == 0)) {
            pIVar28->NavLastIds[1] = IVar24;
          }
        }
      }
      if ((node->VisibleWindow != (ImGuiWindow *)0x0) &&
         (((char)local_e8 != '\0' || (pIVar29->VisibleWindow == (ImGuiWindow *)0x0)))) {
        pIVar29->VisibleWindow = node->VisibleWindow;
      }
      local_8c = (short)uVar40;
      if ((-1 < local_8c) && (node->VisibleWindow != (ImGuiWindow *)0x0)) {
        if (node->VisibleWindow->HasCloseButton == false) {
          PushItemFlag(4,true);
          fStack_7c = (pIVar19->Style).Colors[0].w * 0.5;
          _tab_open = (pIVar19->Style).Colors[0].x;
          unique0x1000120f = (pIVar19->Style).Colors[0].y;
          fStack_80 = (pIVar19->Style).Colors[0].z;
          PushStyleColor(0,(ImVec4 *)&tab_open);
        }
        fVar48 = pIVar19->FontSize;
        IVar25 = ImGuiWindow::GetID(pIVar28,"#CLOSE",(char *)0x0);
        fVar49 = (pIVar19->Style).FramePadding.x;
        unique0x1000039d = (float)window_label._4_4_ + 0.0;
        _tab_open = (float)window_label._8_4_ + ((-fVar49 - fVar49) - fVar48);
        bVar21 = CloseButton(IVar25,(ImVec2 *)&tab_open);
        if ((bVar21) &&
           (pIVar31 = TabBarFindTabByID(this_00,this_00->VisibleTabId),
           pIVar31 != (ImGuiTabItem *)0x0)) {
          node->WantCloseTabId = pIVar31->ID;
          TabBarCloseTab(this_00,pIVar31);
        }
        if (node->VisibleWindow->HasCloseButton == false) {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar25 = ImGuiWindow::GetID(pIVar28,"#TITLEBAR",(char *)0x0);
      if (((pIVar19->HoveredId == 0) || (pIVar19->HoveredId == IVar25)) ||
         (pIVar19->ActiveId == IVar25)) {
        ButtonBehavior((ImRect *)window_label,IVar25,(bool *)0x0,&tab_open,0x1000);
        if (pIVar19->HoveredId == IVar25) {
          (pIVar28->DC).LastItemId = IVar25;
          SetItemAllowOverlap();
        }
        if (tab_open == true) {
          pfVar2 = (GImGui->IO).MouseDownDuration;
          IVar25 = this_00->SelectedTabId;
          if (*pfVar2 != 0.0) {
            IVar25 = local_fc;
          }
          if (NAN(*pfVar2)) {
            IVar25 = local_fc;
          }
          pIVar31 = TabBarFindTabByID(this_00,this_00->SelectedTabId);
          local_fc = IVar25;
          if (pIVar31 != (ImGuiTabItem *)0x0) {
            pIVar30 = pIVar31->Window;
            if (pIVar30 == (ImGuiWindow *)0x0) {
              pIVar30 = node->HostWindow;
            }
            StartMouseMovingWindowOrNode(pIVar30,node,false);
          }
        }
      }
      if (this_00->NextSelectedTabId != 0) {
        local_fc = this_00->NextSelectedTabId;
      }
      if (((local_fc != 0) &&
          (pIVar31 = TabBarFindTabByID(this_00,local_fc), pIVar31 != (ImGuiTabItem *)0x0)) &&
         (pIVar31->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar31->Window);
        NavInitWindow(pIVar31->Window,false);
      }
      EndTabBar();
      PopID();
      if ((node->LocalFlags & 0x400) == 0) {
        (pIVar28->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar28->SkipItems = bVar47;
      }
      goto LAB_00133342;
    }
    if (pIVar43->Size < 1) {
      pIVar30 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
      pIVar30 = *ppIVar26;
    }
    node->VisibleWindow = pIVar30;
    *(ushort *)&node->field_0xb8 =
         (ushort)*(undefined4 *)&node->field_0xb8 & 0xfbff | (ushort)(local_e8 << 10);
    if ((byte)local_e8 == 0) {
      if (pIVar30 != (ImGuiWindow *)0x0) {
        if (pIVar29->VisibleWindow == (ImGuiWindow *)0x0) goto LAB_0013372c;
        goto LAB_00133733;
      }
      goto LAB_00133342;
    }
    node->LastFrameFocused = pIVar19->FrameCount;
    if (pIVar30 == (ImGuiWindow *)0x0) goto LAB_00133342;
LAB_0013372c:
    pIVar29->VisibleWindow = pIVar30;
LAB_00133733:
    if (node->TabBar != (ImGuiTabBar *)0x0) {
      node->TabBar->VisibleTabId = node->VisibleWindow->ID;
      goto LAB_00133342;
    }
LAB_00133352:
    if (pIVar43->Size < 1) goto LAB_00133372;
    ppIVar26 = ImVector<ImGuiWindow_*>::operator[](pIVar43,0);
    IVar25 = (*ppIVar26)->ID;
  }
  else {
    uVar33 = *(ushort *)&node->field_0xb8;
LAB_0013332f:
    node->WantCloseTabId = 0;
    *(ushort *)&node->field_0xb8 = uVar33 & 0xbbff;
LAB_00133342:
    if ((node->TabBar == (ImGuiTabBar *)0x0) || (IVar25 = node->TabBar->SelectedTabId, IVar25 == 0))
    goto LAB_00133352;
  }
  node->SelectedTabId = IVar25;
LAB_00133372:
  if (bVar46) {
    if ((((node->field_0xb9 & 2) != 0) && (node->ParentNode == (ImGuiDockNode *)0x0)) &&
       ((pIVar18->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar18->MovingWindow->RootWindow != pIVar28)))) {
      BeginDockableDragDropTarget(pIVar28);
    }
    node->LastFrameActive = pIVar18->FrameCount;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[0]);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdate(node->ChildNodes[1]);
    }
    if (node->ParentNode == (ImGuiDockNode *)0x0) {
      RenderWindowOuterBorders(pIVar28);
    }
  }
  else {
    node->LastFrameActive = pIVar18->FrameCount;
  }
  if (bVar6) {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->Windows.Size <= 1 && node->IsFloatingNode() && node->IsLeafNode())
        if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
            want_to_hide_host_window = true;
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = node->EnableCloseButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->GetMergedFlags();

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        node->EnableCloseButton = false;
        node->HasCloseButton = (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        node->EnableCloseButton = false;
        node->HasCloseButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        for (int window_n = 0; window_n < node->Windows.Size; window_n++)
        {
            // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
            ImGuiWindow* window = node->Windows[window_n];
            window->DockIsActive = (node->Windows.Size > 1);
            node->EnableCloseButton |= window->HasCloseButton;
        }

        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            node->HostWindow = host_window = g.CurrentWindow;
            host_window->DockNodeAsHost = node;
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindowDockStop->DockNode && g.NavWindow->RootWindowDockStop->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindowDockStop->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size after
    // processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    const ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // Add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImRect central_hole(central_node->Pos, central_node->Pos + central_node->Size);
        central_hole.Expand(ImVec2(-WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, -WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS));
        if (central_node_hole && !central_hole.IsInverted())
        {
            SetWindowHitTestHole(host_window, central_hole.Min, central_hole.Max - central_hole.Min);
            SetWindowHitTestHole(host_window->ParentWindow, central_hole.Min, central_hole.Max - central_hole.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindow != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}